

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

uint32_t __thiscall
booster::locale::util::base_converter::to_unicode(base_converter *this,char **begin,char *end)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = *begin;
  if (pcVar2 == end) {
    return 0xfffffffe;
  }
  cVar1 = *pcVar2;
  if (-1 < cVar1) {
    *begin = pcVar2 + 1;
    return (int)cVar1;
  }
  return 0xffffffff;
}

Assistant:

virtual uint32_t to_unicode(char const *&begin,char const *end) 
        {
            if(begin == end)
                return incomplete;
            unsigned char cp = *begin;
            if(cp <= 0x7F) {
                begin++;
                return cp;
            }
            return illegal;
        }